

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

int stbiw__jpg_processDU
              (stbi__write_context *s,int *bitBuf,int *bitCnt,float *CDU,int du_stride,float *fdtbl,
              int DC,unsigned_short (*HTDC) [2],unsigned_short (*HTAC) [2])

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  sbyte sVar10;
  undefined1 auVar11 [32];
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  byte bVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  float *pfVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 in_ZMM3 [64];
  unsigned_short bits [2];
  int startpos;
  unsigned_short local_148 [2];
  unsigned_short local_144 [2];
  long local_140;
  int DU [64];
  
  local_144 = *HTAC;
  local_148 = HTAC[0xf0];
  lVar15 = (long)du_stride;
  if (du_stride != 0) {
    pfVar21 = CDU + 7;
    lVar18 = 0;
    do {
      stbiw__jpg_DCT(pfVar21 + -7,pfVar21 + -6,pfVar21 + -5,pfVar21 + -4,pfVar21 + -3,pfVar21 + -2,
                     pfVar21 + -1,pfVar21);
      lVar18 = lVar18 + lVar15;
      pfVar21 = pfVar21 + lVar15;
    } while (lVar18 < (long)(ulong)(uint)(du_stride * 8));
  }
  lVar18 = 0;
  local_140 = lVar15;
  do {
    stbiw__jpg_DCT((float *)((long)CDU + lVar18),(float *)((long)CDU + lVar18 + lVar15 * 4),
                   (float *)((long)CDU + lVar18 + (ulong)(uint)(du_stride * 2) * 4),
                   (float *)((long)CDU + lVar18 + (long)(du_stride * 3) * 4),
                   (float *)((long)CDU + lVar18 + (ulong)(uint)(du_stride * 4) * 4),
                   (float *)((long)CDU + lVar18 + (long)(du_stride * 5) * 4),
                   (float *)((long)CDU + lVar18 + (long)(du_stride * 6) * 4),
                   (float *)((long)CDU + lVar18 + (long)(du_stride * 7) * 4));
    lVar18 = lVar18 + 4;
  } while (lVar18 != 0x20);
  lVar18 = 8;
  lVar15 = 0;
  auVar26._8_4_ = 0x3f000000;
  auVar26._0_8_ = 0x3f0000003f000000;
  auVar26._12_4_ = 0x3f000000;
  auVar26._16_4_ = 0x3f000000;
  auVar26._20_4_ = 0x3f000000;
  auVar26._24_4_ = 0x3f000000;
  auVar26._28_4_ = 0x3f000000;
  do {
    lVar17 = (long)(int)lVar15;
    lVar15 = lVar17 + 8;
    pfVar21 = fdtbl + lVar17;
    auVar11._4_4_ = CDU[1] * pfVar21[1];
    auVar11._0_4_ = *CDU * *pfVar21;
    auVar11._8_4_ = CDU[2] * pfVar21[2];
    auVar11._12_4_ = CDU[3] * pfVar21[3];
    auVar11._16_4_ = CDU[4] * pfVar21[4];
    auVar11._20_4_ = CDU[5] * pfVar21[5];
    auVar11._24_4_ = CDU[6] * pfVar21[6];
    auVar11._28_4_ = CDU[7];
    uVar20 = vcmpps_avx512vl(auVar11,ZEXT1632(ZEXT816(0) << 0x40),1);
    auVar25._8_4_ = 0xbf000000;
    auVar25._0_8_ = 0xbf000000bf000000;
    auVar25._12_4_ = 0xbf000000;
    auVar25._16_4_ = 0xbf000000;
    auVar25._20_4_ = 0xbf000000;
    auVar25._24_4_ = 0xbf000000;
    auVar25._28_4_ = 0xbf000000;
    auVar25 = vblendmps_avx512vl(auVar26,auVar25);
    bVar2 = (bool)((byte)uVar20 & 1);
    bVar3 = (bool)((byte)(uVar20 >> 1) & 1);
    bVar4 = (bool)((byte)(uVar20 >> 2) & 1);
    bVar5 = (bool)((byte)(uVar20 >> 3) & 1);
    bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
    bVar7 = (bool)((byte)(uVar20 >> 5) & 1);
    bVar8 = (bool)((byte)(uVar20 >> 6) & 1);
    bVar9 = SUB81(uVar20 >> 7,0);
    auVar27._0_4_ =
         (int)(*CDU * *pfVar21 + (float)((uint)bVar2 * auVar25._0_4_ | (uint)!bVar2 * in_ZMM3._0_4_)
              );
    auVar27._4_4_ =
         (int)(CDU[1] * pfVar21[1] +
              (float)((uint)bVar3 * auVar25._4_4_ | (uint)!bVar3 * in_ZMM3._4_4_));
    auVar27._8_4_ =
         (int)(CDU[2] * pfVar21[2] +
              (float)((uint)bVar4 * auVar25._8_4_ | (uint)!bVar4 * in_ZMM3._8_4_));
    auVar27._12_4_ =
         (int)(CDU[3] * pfVar21[3] +
              (float)((uint)bVar5 * auVar25._12_4_ | (uint)!bVar5 * in_ZMM3._12_4_));
    auVar27._16_4_ =
         (int)(CDU[4] * pfVar21[4] +
              (float)((uint)bVar6 * auVar25._16_4_ | (uint)!bVar6 * in_ZMM3._16_4_));
    auVar27._20_4_ =
         (int)(CDU[5] * pfVar21[5] +
              (float)((uint)bVar7 * auVar25._20_4_ | (uint)!bVar7 * in_ZMM3._20_4_));
    auVar27._24_4_ =
         (int)(CDU[6] * pfVar21[6] +
              (float)((uint)bVar8 * auVar25._24_4_ | (uint)!bVar8 * in_ZMM3._24_4_));
    auVar27._28_4_ =
         (int)(CDU[7] + (float)((uint)bVar9 * auVar25._28_4_ | (uint)!bVar9 * in_ZMM3._28_4_));
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)("" + lVar17);
    auVar25 = vpmovzxbd_avx2(auVar1);
    in_ZMM3 = ZEXT3264(auVar25);
    vpscatterdd_avx512vl(ZEXT832(DU) + auVar25 * (undefined1  [32])0x4,0xffff,auVar27);
    CDU = CDU + local_140;
    lVar18 = lVar18 + -1;
  } while (lVar18 != 0);
  uVar12 = DU[0] - DC;
  if (uVar12 != 0) {
    uVar14 = -uVar12;
    if (0 < (int)uVar12) {
      uVar14 = uVar12;
    }
    uVar13 = 1;
    if (1 < uVar14) {
      uVar13 = 0x20 - LZCOUNT(uVar14);
    }
    bits[1] = (unsigned_short)uVar13;
    sVar10 = ((byte)uVar13 < 0x21) * (' ' - (byte)uVar13);
    bits[0] = (unsigned_short)((((int)uVar12 >> 0x1f) + uVar12 << sVar10) >> sVar10);
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,HTDC[uVar13 & 0xff]);
    HTDC = &bits;
  }
  stbiw__jpg_writeBits(s,bitBuf,bitCnt,*HTDC);
  uVar12 = 0x40;
  do {
    uVar20 = (ulong)(uVar12 - 1);
    if (DU[uVar20] != 0) goto LAB_00295b3a;
    uVar12 = uVar12 - 1;
  } while (1 < uVar12);
  uVar20 = 0;
LAB_00295b3a:
  iVar19 = (int)uVar20;
  if (iVar19 != 0) {
    if (0 < iVar19) {
      iVar24 = 1;
      do {
        lVar15 = (long)iVar24;
        uVar14 = 0xffffffff;
        uVar12 = 0;
        do {
          uVar22 = uVar12;
          uVar13 = DU[lVar15];
          uVar14 = uVar14 + 1;
          if ((long)uVar20 < lVar15) break;
          lVar15 = lVar15 + 1;
          uVar12 = uVar22 + 1;
        } while (uVar13 == 0);
        uVar12 = uVar14;
        if (0xf < (int)uVar14) {
          uVar22 = uVar22 >> 4;
          iVar23 = uVar22 + (uVar22 == 0);
          do {
            stbiw__jpg_writeBits(s,bitBuf,bitCnt,local_148);
            iVar23 = iVar23 + -1;
          } while (iVar23 != 0);
          uVar12 = uVar14 & 0xf;
        }
        iVar23 = iVar24 + uVar14;
        uVar22 = -uVar13;
        if (0 < (int)uVar13) {
          uVar22 = uVar13;
        }
        bits[1] = 0x20 - (short)LZCOUNT(uVar22);
        if (uVar22 < 2) {
          bits[1] = 1;
        }
        bVar16 = (byte)bits[1];
        sVar10 = (bVar16 < 0x21) * (' ' - bVar16);
        bits[0] = (unsigned_short)((((int)uVar13 >> 0x1f) + uVar13 << sVar10) >> sVar10);
        stbiw__jpg_writeBits(s,bitBuf,bitCnt,HTAC[(int)(uVar12 * 0x10 + (uint)bVar16)]);
        stbiw__jpg_writeBits(s,bitBuf,bitCnt,bits);
        iVar24 = iVar24 + 1 + uVar14;
      } while (iVar23 < iVar19);
    }
    if (iVar19 == 0x3f) {
      return DU[0];
    }
  }
  stbiw__jpg_writeBits(s,bitBuf,bitCnt,local_144);
  return DU[0];
}

Assistant:

static int stbiw__jpg_processDU(stbi__write_context *s, int *bitBuf, int *bitCnt, float *CDU, int du_stride, float *fdtbl, int DC, const unsigned short HTDC[256][2], const unsigned short HTAC[256][2]) {
   const unsigned short EOB[2] = { HTAC[0x00][0], HTAC[0x00][1] };
   const unsigned short M16zeroes[2] = { HTAC[0xF0][0], HTAC[0xF0][1] };
   int dataOff, i, j, n, diff, end0pos, x, y;
   int DU[64];

   // DCT rows
   for(dataOff=0, n=du_stride*8; dataOff<n; dataOff+=du_stride) {
      stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff+1], &CDU[dataOff+2], &CDU[dataOff+3], &CDU[dataOff+4], &CDU[dataOff+5], &CDU[dataOff+6], &CDU[dataOff+7]);
   }
   // DCT columns
   for(dataOff=0; dataOff<8; ++dataOff) {
      stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff+du_stride], &CDU[dataOff+du_stride*2], &CDU[dataOff+du_stride*3], &CDU[dataOff+du_stride*4],
                     &CDU[dataOff+du_stride*5], &CDU[dataOff+du_stride*6], &CDU[dataOff+du_stride*7]);
   }
   // Quantize/descale/zigzag the coefficients
   for(y = 0, j=0; y < 8; ++y) {
      for(x = 0; x < 8; ++x,++j) {
         float v;
         i = y*du_stride+x;
         v = CDU[i]*fdtbl[j];
         // DU[stbiw__jpg_ZigZag[j]] = (int)(v < 0 ? ceilf(v - 0.5f) : floorf(v + 0.5f));
         // ceilf() and floorf() are C99, not C89, but I /think/ they're not needed here anyway?
         DU[stbiw__jpg_ZigZag[j]] = (int)(v < 0 ? v - 0.5f : v + 0.5f);
      }
   }

   // Encode DC
   diff = DU[0] - DC;
   if (diff == 0) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[0]);
   } else {
      unsigned short bits[2];
      stbiw__jpg_calcBits(diff, bits);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[bits[1]]);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
   }
   // Encode ACs
   end0pos = 63;
   for(; (end0pos>0)&&(DU[end0pos]==0); --end0pos) {
   }
   // end0pos = first element in reverse order !=0
   if(end0pos == 0) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
      return DU[0];
   }
   for(i = 1; i <= end0pos; ++i) {
      int startpos = i;
      int nrzeroes;
      unsigned short bits[2];
      for (; DU[i]==0 && i<=end0pos; ++i) {
      }
      nrzeroes = i-startpos;
      if ( nrzeroes >= 16 ) {
         int lng = nrzeroes>>4;
         int nrmarker;
         for (nrmarker=1; nrmarker <= lng; ++nrmarker)
            stbiw__jpg_writeBits(s, bitBuf, bitCnt, M16zeroes);
         nrzeroes &= 15;
      }
      stbiw__jpg_calcBits(DU[i], bits);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTAC[(nrzeroes<<4)+bits[1]]);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
   }
   if(end0pos != 63) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
   }
   return DU[0];
}